

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_destructor.h
# Opt level: O0

Nonnull<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet_*>
absl::lts_20250127::
NoDestructor<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet>::
PlacementImpl::Launder<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet>
          (Nonnull<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet_*> p)

{
  GlobalLogSinkSet *pGVar1;
  Nonnull<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet_*> p_local;
  
  pGVar1 = std::launder<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet>
                     (p);
  return pGVar1;
}

Assistant:

static absl::Nonnull<P*> Launder(absl::Nonnull<P*> p) {
#if defined(__cpp_lib_launder) && __cpp_lib_launder >= 201606L
      return std::launder(p);
#elif ABSL_HAVE_BUILTIN(__builtin_launder)
      return __builtin_launder(p);
#else
      // When `std::launder` or equivalent are not available, we rely on
      // undefined behavior, which works as intended on Abseil's officially
      // supported platforms as of Q3 2023.
#if defined(__GNUC__) && !defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wstrict-aliasing"
#endif
      return p;
#if defined(__GNUC__) && !defined(__clang__)
#pragma GCC diagnostic pop
#endif
#endif
    }